

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk.c
# Opt level: O0

int mbedtls_pk_check_pair
              (mbedtls_pk_context *pub,mbedtls_pk_context *prv,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  void *p_rng_local;
  _func_int_void_ptr_uchar_ptr_size_t *f_rng_local;
  mbedtls_pk_context *prv_local;
  mbedtls_pk_context *pub_local;
  
  if ((pub->pk_info == (mbedtls_pk_info_t *)0x0) || (prv->pk_info == (mbedtls_pk_info_t *)0x0)) {
    pub_local._4_4_ = -16000;
  }
  else if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    pub_local._4_4_ = -16000;
  }
  else if (prv->pk_info->check_pair_func ==
           (_func_int_mbedtls_pk_context_ptr_mbedtls_pk_context_ptr__func_int_void_ptr_uchar_ptr_size_t_ptr_void_ptr
            *)0x0) {
    pub_local._4_4_ = -0x3980;
  }
  else {
    if (prv->pk_info->type == MBEDTLS_PK_RSA_ALT) {
      if (pub->pk_info->type != MBEDTLS_PK_RSA) {
        return -0x3f00;
      }
    }
    else if ((prv->pk_info->type != MBEDTLS_PK_OPAQUE) && (pub->pk_info != prv->pk_info)) {
      return -0x3f00;
    }
    pub_local._4_4_ = (*prv->pk_info->check_pair_func)(pub,prv,f_rng,p_rng);
  }
  return pub_local._4_4_;
}

Assistant:

int mbedtls_pk_check_pair(const mbedtls_pk_context *pub,
                          const mbedtls_pk_context *prv,
                          int (*f_rng)(void *, unsigned char *, size_t),
                          void *p_rng)
{
    if (pub->pk_info == NULL ||
        prv->pk_info == NULL) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (f_rng == NULL) {
        return MBEDTLS_ERR_PK_BAD_INPUT_DATA;
    }

    if (prv->pk_info->check_pair_func == NULL) {
        return MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE;
    }

    if (prv->pk_info->type == MBEDTLS_PK_RSA_ALT) {
        if (pub->pk_info->type != MBEDTLS_PK_RSA) {
            return MBEDTLS_ERR_PK_TYPE_MISMATCH;
        }
    } else {
        if ((prv->pk_info->type != MBEDTLS_PK_OPAQUE) &&
            (pub->pk_info != prv->pk_info)) {
            return MBEDTLS_ERR_PK_TYPE_MISMATCH;
        }
    }

    return prv->pk_info->check_pair_func((mbedtls_pk_context *) pub,
                                         (mbedtls_pk_context *) prv,
                                         f_rng, p_rng);
}